

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ParseField
          (ParserImpl *this,FieldDescriptor *field,Message *output)

{
  int iVar1;
  bool bVar2;
  Reflection *reflection;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_28,&local_30);
  }
  iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
  (*(output->super_MessageLite)._vptr_MessageLite[0x11])(output);
  if (iVar1 == 10) {
    bVar2 = ConsumeFieldMessage(this,output,reflection,field);
  }
  else {
    bVar2 = ConsumeFieldValue(this,output,reflection,field);
  }
  return (bool)((this->tokenizer_).current_.type == TYPE_END & bVar2);
}

Assistant:

bool ParseField(const FieldDescriptor* field, Message* output) {
    bool suc;
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      suc = ConsumeFieldMessage(output, output->GetReflection(), field);
    } else {
      suc = ConsumeFieldValue(output, output->GetReflection(), field);
    }
    return suc && LookingAtType(io::Tokenizer::TYPE_END);
  }